

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O0

void __thiscall DROPlayer::DoCommand_v2(DROPlayer *this)

{
  byte bVar1;
  byte data_00;
  uint uVar2;
  UINT32 UVar3;
  UINT8 data;
  UINT8 reg;
  UINT8 port;
  DROPlayer *this_local;
  
  uVar2 = this->_filePos;
  UVar3 = DataLoader_GetSize(this->_dLoad);
  if (uVar2 < UVar3) {
    bVar1 = this->_fileData[this->_filePos];
    data_00 = this->_fileData[this->_filePos + 1];
    this->_filePos = this->_filePos + 2;
    if (bVar1 == (this->_fileHdr).cmdDlyShort) {
      this->_fileTick = data_00 + 1 + this->_fileTick;
    }
    else if (bVar1 == (this->_fileHdr).cmdDlyLong) {
      this->_fileTick = (data_00 + 1) * 0x100 + this->_fileTick;
    }
    else if ((bVar1 & 0x7f) < (this->_fileHdr).regCmdCnt) {
      WriteReg(this,(UINT8)((int)(bVar1 & 0x80) >> 7),(this->_fileHdr).regCmdMap[bVar1 & 0x7f],
               data_00);
    }
  }
  else {
    DoFileEnd(this);
  }
  return;
}

Assistant:

void DROPlayer::DoCommand_v2(void)
{
	if (_filePos >= DataLoader_GetSize(_dLoad))
	{
		DoFileEnd();
		return;
	}
	
	UINT8 port;
	UINT8 reg;
	UINT8 data;
	
	//emu_logf(&_logger, PLRLOG_TRACE, "[DRO v2] Ofs %04X, Command %02X data %02X\n", _filePos, _fileData[_filePos], _fileData[_filePos+1]);
	reg = _fileData[_filePos + 0x00];
	data = _fileData[_filePos + 0x01];
	_filePos += 0x02;
	if (reg == _fileHdr.cmdDlyShort)
	{
		_fileTick += (1 + data);
		return;
	}
	else if (reg == _fileHdr.cmdDlyLong)
	{
		_fileTick += (1 + data) << 8;
		return;
	}
	port = (reg & 0x80) >> 7;
	reg &= 0x7F;
	if (reg >= _fileHdr.regCmdCnt)
		return;	// invalid register
	
	reg = _fileHdr.regCmdMap[reg];
	WriteReg(port, reg, data);
	
	return;
}